

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QLayoutItem * __thiscall
QMainWindowLayoutState::takeAt(QMainWindowLayoutState *this,int index,int *x)

{
  QLayoutItem *pQVar1;
  
  pQVar1 = QToolBarAreaLayout::takeAt(&this->toolBarAreaLayout,x,index);
  if (pQVar1 != (QLayoutItem *)0x0) {
    return pQVar1;
  }
  pQVar1 = QDockAreaLayout::takeAt(&this->dockAreaLayout,x,index);
  return pQVar1;
}

Assistant:

QLayoutItem *QMainWindowLayoutState::takeAt(int index, int *x)
{
#if QT_CONFIG(toolbar)
    if (QLayoutItem *ret = toolBarAreaLayout.takeAt(x, index))
        return ret;
#endif

#if QT_CONFIG(dockwidget)
    if (QLayoutItem *ret = dockAreaLayout.takeAt(x, index))
        return ret;
#else
    if (centralWidgetItem && (*x)++ == index) {
        QLayoutItem *ret = centralWidgetItem;
        centralWidgetItem = nullptr;
        return ret;
    }
#endif

    return nullptr;
}